

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyDebugNames
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData)

{
  uint *this_00;
  bool bVar1;
  uint uVar2;
  DWARFObject *Obj;
  raw_ostream *prVar3;
  const_iterator pNVar4;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar5;
  pointer pDVar6;
  uint64_t CUOffset;
  NameIndex *NI_00;
  DWARFUnit *this_01;
  Error *E_00;
  NameIterator NVar7;
  unit_iterator_range uVar8;
  die_iterator_range dVar9;
  DWARFDie local_288;
  reference local_278;
  DWARFDebugInfoEntry *Die;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  __end3;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  __begin3;
  die_iterator_range *__range3;
  DWARFCompileUnit *CU;
  NameIndex *NI_3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *U;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1_3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1_3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_218;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_210;
  unit_iterator_range *__range1_3;
  NameTableEntry NTE;
  undefined1 local_1c8 [8];
  NameIterator __end2;
  undefined1 local_1a8 [8];
  NameIterator __begin2;
  NameIndex *__range2;
  NameIndex *NI_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  DWARFDebugNames *__range1_2;
  NameIndex *NI_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  DWARFDebugNames *__range1_1;
  NameIndex *NI;
  const_iterator __end1;
  const_iterator __begin1;
  DWARFDebugNames *__range1;
  Error local_128;
  string local_120;
  undefined1 local_100 [8];
  Error E;
  DWARFDebugNames AccelTable;
  DWARFDataExtractor AccelSectionData;
  uint NumErrors;
  DataExtractor *StrData_local;
  DWARFSection *AccelSection_local;
  DWARFVerifier *this_local;
  
  Obj = DWARFContext::getDWARFObj(this->DCtx);
  bVar1 = DWARFContext::isLittleEndian(this->DCtx);
  this_00 = &AccelTable.CUToNameIndex.NumBuckets;
  DWARFDataExtractor::DWARFDataExtractor((DWARFDataExtractor *)this_00,Obj,AccelSection,bVar1,'\0');
  DWARFDebugNames::DWARFDebugNames
            ((DWARFDebugNames *)&stack0xffffffffffffff38,(DWARFDataExtractor *)this_00,*StrData);
  raw_ostream::operator<<(this->OS,"Verifying .debug_names...\n");
  DWARFDebugNames::extract((DWARFDebugNames *)local_100);
  bVar1 = Error::operator_cast_to_bool((Error *)local_100);
  if (bVar1) {
    prVar3 = error(this);
    Error::Error(&local_128,(Error *)local_100);
    toString_abi_cxx11_(&local_120,(llvm *)&local_128,E_00);
    prVar3 = raw_ostream::operator<<(prVar3,&local_120);
    raw_ostream::operator<<(prVar3,'\n');
    std::__cxx11::string::~string((string *)&local_120);
    Error::~Error(&local_128);
    this_local._4_4_ = 1;
  }
  Error::~Error((Error *)local_100);
  if (!bVar1) {
    AccelSectionData.Section._4_4_ =
         verifyDebugNamesCULists(this,(DWARFDebugNames *)&stack0xffffffffffffff38);
    __end1 = DWARFDebugNames::begin((DWARFDebugNames *)&stack0xffffffffffffff38);
    pNVar4 = DWARFDebugNames::end((DWARFDebugNames *)&stack0xffffffffffffff38);
    for (; __end1 != pNVar4; __end1 = __end1 + 1) {
      uVar2 = verifyNameIndexBuckets(this,__end1,StrData);
      AccelSectionData.Section._4_4_ = uVar2 + AccelSectionData.Section._4_4_;
    }
    __end1_1 = DWARFDebugNames::begin((DWARFDebugNames *)&stack0xffffffffffffff38);
    pNVar4 = DWARFDebugNames::end((DWARFDebugNames *)&stack0xffffffffffffff38);
    for (; __end1_1 != pNVar4; __end1_1 = __end1_1 + 1) {
      uVar2 = verifyNameIndexAbbrevs(this,__end1_1);
      AccelSectionData.Section._4_4_ = uVar2 + AccelSectionData.Section._4_4_;
    }
    if (AccelSectionData.Section._4_4_ == 0) {
      __end1_2 = DWARFDebugNames::begin((DWARFDebugNames *)&stack0xffffffffffffff38);
      pNVar4 = DWARFDebugNames::end((DWARFDebugNames *)&stack0xffffffffffffff38);
      for (; __end1_2 != pNVar4; __end1_2 = __end1_2 + 1) {
        __begin2._8_8_ = __end1_2;
        NVar7 = DWARFDebugNames::NameIndex::begin(__end1_2);
        __end2._8_8_ = NVar7.CurrentIndex;
        __begin2.CurrentIndex._0_4_ = NVar7.CurrentName;
        local_1a8 = (undefined1  [8])__end2._8_8_;
        NVar7 = DWARFDebugNames::NameIndex::end((NameIndex *)__begin2._8_8_);
        NTE.EntryOffset = (uint64_t)NVar7.CurrentIndex;
        __end2.CurrentIndex._0_4_ = NVar7.CurrentName;
        local_1c8 = (undefined1  [8])NTE.EntryOffset;
        while (bVar1 = llvm::operator!=((NameIterator *)local_1a8,(NameIterator *)local_1c8), bVar1)
        {
          DWARFDebugNames::NameIterator::operator*
                    ((NameTableEntry *)&__range1_3,(NameIterator *)local_1a8);
          uVar2 = verifyNameIndexEntries(this,__end1_2,(NameTableEntry *)&__range1_3);
          AccelSectionData.Section._4_4_ = uVar2 + AccelSectionData.Section._4_4_;
          DWARFDebugNames::NameIterator::operator++((NameIterator *)local_1a8);
        }
      }
      if (AccelSectionData.Section._4_4_ == 0) {
        uVar8 = DWARFContext::compile_units(this->DCtx);
        local_218 = uVar8.end_iterator;
        __begin1_3 = uVar8.begin_iterator;
        local_210 = (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                     *)&__begin1_3;
        __end1_3 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                   ::begin(local_210);
        puVar5 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                 ::end(local_210);
        for (; __end1_3 != puVar5; __end1_3 = __end1_3 + 1) {
          pDVar6 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::
                   operator->(__end1_3);
          CUOffset = DWARFUnit::getOffset(pDVar6);
          NI_00 = DWARFDebugNames::getCUNameIndex
                            ((DWARFDebugNames *)&stack0xffffffffffffff38,CUOffset);
          if (NI_00 != (NameIndex *)0x0) {
            pDVar6 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get
                               (__end1_3);
            this_01 = &cast<llvm::DWARFCompileUnit,llvm::DWARFUnit>(pDVar6)->super_DWARFUnit;
            dVar9 = DWARFUnit::dies(this_01);
            __begin3 = dVar9.begin_iterator._M_current;
            __end3 = iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>_>
                     ::begin((iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>_>
                              *)&__begin3);
            Die = (DWARFDebugInfoEntry *)
                  iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>_>
                  ::end((iterator_range<__gnu_cxx::__normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>_>
                         *)&__begin3);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
                                               *)&Die), bVar1) {
              local_278 = __gnu_cxx::
                          __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
                          ::operator*(&__end3);
              DWARFDie::DWARFDie(&local_288,this_01,local_278);
              uVar2 = verifyNameIndexCompleteness(this,&local_288,NI_00);
              AccelSectionData.Section._4_4_ = uVar2 + AccelSectionData.Section._4_4_;
              __gnu_cxx::
              __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
              ::operator++(&__end3);
            }
          }
        }
        this_local._4_4_ = AccelSectionData.Section._4_4_;
      }
      else {
        this_local._4_4_ = AccelSectionData.Section._4_4_;
      }
    }
    else {
      this_local._4_4_ = AccelSectionData.Section._4_4_;
    }
  }
  DWARFDebugNames::~DWARFDebugNames((DWARFDebugNames *)&stack0xffffffffffffff38);
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugNames(const DWARFSection &AccelSection,
                                         const DataExtractor &StrData) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), AccelSection,
                                      DCtx.isLittleEndian(), 0);
  DWARFDebugNames AccelTable(AccelSectionData, StrData);

  OS << "Verifying .debug_names...\n";

  // This verifies that we can read individual name indices and their
  // abbreviation tables.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  NumErrors += verifyDebugNamesCULists(AccelTable);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexBuckets(NI, StrData);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexAbbrevs(NI);

  // Don't attempt Entry validation if any of the previous checks found errors
  if (NumErrors > 0)
    return NumErrors;
  for (const auto &NI : AccelTable)
    for (DWARFDebugNames::NameTableEntry NTE : NI)
      NumErrors += verifyNameIndexEntries(NI, NTE);

  if (NumErrors > 0)
    return NumErrors;

  for (const std::unique_ptr<DWARFUnit> &U : DCtx.compile_units()) {
    if (const DWARFDebugNames::NameIndex *NI =
            AccelTable.getCUNameIndex(U->getOffset())) {
      auto *CU = cast<DWARFCompileUnit>(U.get());
      for (const DWARFDebugInfoEntry &Die : CU->dies())
        NumErrors += verifyNameIndexCompleteness(DWARFDie(CU, &Die), *NI);
    }
  }
  return NumErrors;
}